

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write-cmake.cpp
# Opt level: O0

bool __thiscall
CMakeWriter::handle_library
          (CMakeWriter *this,ChibiInfo *chibi_info,ChibiLibrary *library,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *traversed_libraries,vector<ChibiLibrary_*,_std::allocator<ChibiLibrary_*>_> *libraries)

{
  bool bVar1;
  size_type sVar2;
  char *name;
  undefined8 uVar3;
  undefined8 uVar4;
  ChibiLibrary *local_78;
  ChibiLibrary *local_70;
  ChibiLibrary *found_library;
  ChibiLibraryDependency *library_dependency;
  iterator __end1;
  iterator __begin1;
  vector<ChibiLibraryDependency,_std::allocator<ChibiLibraryDependency>_> *__range1;
  vector<ChibiLibrary_*,_std::allocator<ChibiLibrary_*>_> *libraries_local;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *traversed_libraries_local;
  ChibiLibrary *library_local;
  ChibiInfo *chibi_info_local;
  CMakeWriter *this_local;
  
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::insert(traversed_libraries,&library->name);
  __end1 = std::vector<ChibiLibraryDependency,_std::allocator<ChibiLibraryDependency>_>::begin
                     (&library->library_dependencies);
  library_dependency =
       (ChibiLibraryDependency *)
       std::vector<ChibiLibraryDependency,_std::allocator<ChibiLibraryDependency>_>::end
                 (&library->library_dependencies);
  do {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<ChibiLibraryDependency_*,_std::vector<ChibiLibraryDependency,_std::allocator<ChibiLibraryDependency>_>_>
                                *)&library_dependency);
    if (!bVar1) {
      local_78 = library;
      std::vector<ChibiLibrary_*,_std::allocator<ChibiLibrary_*>_>::push_back(libraries,&local_78);
      return true;
    }
    found_library =
         (ChibiLibrary *)
         __gnu_cxx::
         __normal_iterator<ChibiLibraryDependency_*,_std::vector<ChibiLibraryDependency,_std::allocator<ChibiLibraryDependency>_>_>
         ::operator*(&__end1);
    sVar2 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::count(traversed_libraries,(key_type *)found_library);
    if (sVar2 == 0) {
      if (*(int *)&found_library->group_name == 1) {
        name = (char *)std::__cxx11::string::c_str();
        local_70 = ChibiInfo::find_library(chibi_info,name);
        if (local_70 == (ChibiLibrary *)0x0) {
          uVar3 = std::__cxx11::string::c_str();
          uVar4 = std::__cxx11::string::c_str();
          report_error((char *)0x0,"failed to find library dependency: %s for target %s",uVar3,uVar4
                      );
          return false;
        }
        bVar1 = handle_library(this,chibi_info,local_70,traversed_libraries,libraries);
        if (!bVar1) {
          return false;
        }
      }
      else if (((*(int *)&found_library->group_name != 2) &&
               (*(int *)&found_library->group_name != 3)) &&
              (*(int *)&found_library->group_name != 4)) {
        report_error((char *)0x0,"internal error: unknown library dependency type");
        return false;
      }
    }
    __gnu_cxx::
    __normal_iterator<ChibiLibraryDependency_*,_std::vector<ChibiLibraryDependency,_std::allocator<ChibiLibraryDependency>_>_>
    ::operator++(&__end1);
  } while( true );
}

Assistant:

bool handle_library(const ChibiInfo & chibi_info, ChibiLibrary & library, std::set<std::string> & traversed_libraries, std::vector<ChibiLibrary*> & libraries)
	{
	#if 0
		if (library.isExecutable)
			printf("handle_app: %s\n", library.name.c_str());
		else
			printf("handle_lib: %s\n", library.name.c_str());
	#endif
	
		traversed_libraries.insert(library.name);
		
		// recurse library dependencies
		
		for (auto & library_dependency : library.library_dependencies)
		{
			if (traversed_libraries.count(library_dependency.name) != 0)
				continue;
			
			if (library_dependency.type == ChibiLibraryDependency::kType_Generated)
			{
				ChibiLibrary * found_library = chibi_info.find_library(library_dependency.name.c_str());
				
				if (found_library == nullptr)
				{
					report_error(nullptr, "failed to find library dependency: %s for target %s", library_dependency.name.c_str(), library.name.c_str());
					return false;
				}
				else
				{
					if (handle_library(chibi_info, *found_library, traversed_libraries, libraries) == false)
						return false;
				}
			}
			else if (library_dependency.type == ChibiLibraryDependency::kType_Local)
			{
				// nothing to do here
			}
			else if (library_dependency.type == ChibiLibraryDependency::kType_Find)
			{
				// nothing to do here
			}
			else if (library_dependency.type == ChibiLibraryDependency::kType_Global)
			{
				// nothing to do here
			}
			else
			{
				report_error(nullptr, "internal error: unknown library dependency type");
				return false;
			}
		}
		
		libraries.push_back(&library);
		
		return true;
	}